

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

s2textformat * __thiscall s2textformat::ToString_abi_cxx11_(s2textformat *this,S2ShapeIndex *index)

{
  int32 iVar1;
  bool bVar2;
  int iVar3;
  int extraout_var;
  ostream *poVar4;
  char *pcVar5;
  ShapeIterator SVar6;
  ShapeIterator it;
  char *local_168;
  undefined1 local_120 [24];
  S2Point local_108;
  uint local_f0;
  int local_ec;
  int e;
  int limit;
  byte local_b1;
  S2LogMessage local_b0;
  S2LogMessageVoidify local_9d;
  undefined8 local_9c;
  Chain chain;
  int i;
  S2Shape *shape;
  ShapeIterator __end2;
  undefined1 local_48 [8];
  ShapeIterator __begin2;
  S2ShapeIndex *__range2;
  int count;
  int local_20;
  int dim;
  S2ShapeIndex *index_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  local_20 = 0;
  do {
    if (2 < local_20) {
      return this;
    }
    if (0 < local_20) {
      std::__cxx11::string::operator+=((string *)this,"#");
    }
    __range2._0_4_ = 0;
    __begin2._8_8_ = index;
    SVar6 = S2ShapeIndex::begin(index);
    local_48 = (undefined1  [8])SVar6.index_;
    __begin2.index_._0_4_ = SVar6.shape_id_;
    SVar6 = S2ShapeIndex::end((S2ShapeIndex *)__begin2._8_8_);
    while (it._12_4_ = 0, it.index_ = (S2ShapeIndex *)SUB128(SVar6._0_12_,0),
          it.shape_id_ = SUB124(SVar6._0_12_,8),
          bVar2 = S2ShapeIndex::ShapeIterator::operator!=((ShapeIterator *)local_48,it), bVar2) {
      register0x00000000 = S2ShapeIndex::ShapeIterator::operator*((ShapeIterator *)local_48);
      if ((register0x00000000 != (S2Shape *)0x0) &&
         (iVar3 = (*register0x00000000->_vptr_S2Shape[4])(), iVar3 == local_20)) {
        if ((int)__range2 < 1) {
          local_168 = "";
          if (0 < local_20) {
            local_168 = " ";
          }
        }
        else {
          local_168 = " | ";
        }
        std::__cxx11::string::operator+=((string *)this,local_168);
        for (chain.start = 0; iVar1 = chain.start,
            iVar3 = (*stack0xffffffffffffff70->_vptr_S2Shape[6])(), iVar1 < iVar3;
            chain.start = chain.start + 1) {
          if (0 < chain.start) {
            pcVar5 = " | ";
            if (local_20 == 2) {
              pcVar5 = "; ";
            }
            std::__cxx11::string::operator+=((string *)this,pcVar5);
          }
          iVar3 = (*stack0xffffffffffffff70->_vptr_S2Shape[7])
                            (stack0xffffffffffffff70,(ulong)(uint)chain.start);
          local_9c = CONCAT44(extraout_var,iVar3);
          if (extraout_var == 0) {
            local_b1 = 0;
            if (local_20 != 2) {
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_b0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
                         ,0x1e7,kFatal,(ostream *)&std::cerr);
              local_b1 = 1;
              poVar4 = S2LogMessage::stream(&local_b0);
              poVar4 = std::operator<<(poVar4,"Check failed: (dim) == (2) ");
              S2LogMessageVoidify::operator&(&local_9d,poVar4);
            }
            if ((local_b1 & 1) != 0) {
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b0);
            }
            std::__cxx11::string::operator+=((string *)this,"full");
          }
          else {
            (*stack0xffffffffffffff70->_vptr_S2Shape[3])(&e,stack0xffffffffffffff70,iVar3);
            AppendVertex((S2Point *)&e,(string *)this);
          }
          local_ec = (uint)local_9c + local_9c._4_4_;
          if (local_20 != 1) {
            local_ec = local_ec + -1;
          }
          for (local_f0 = (uint)local_9c; (int)local_f0 < local_ec; local_f0 = local_f0 + 1) {
            std::__cxx11::string::operator+=((string *)this,", ");
            (*stack0xffffffffffffff70->_vptr_S2Shape[3])
                      (local_120,stack0xffffffffffffff70,(ulong)local_f0);
            AppendVertex(&local_108,(string *)this);
          }
          __range2._0_4_ = (int)__range2 + 1;
        }
      }
      S2ShapeIndex::ShapeIterator::operator++((ShapeIterator *)local_48);
    }
    if ((local_20 == 1) || ((local_20 == 0 && (0 < (int)__range2)))) {
      std::__cxx11::string::operator+=((string *)this," ");
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

string ToString(const S2ShapeIndex& index) {
  string out;
  for (int dim = 0; dim < 3; ++dim) {
    if (dim > 0) out += "#";
    int count = 0;
    for (S2Shape* shape : index) {
      if (shape == nullptr || shape->dimension() != dim) continue;
      out += (count > 0) ? " | " : (dim > 0) ? " " : "";
      for (int i = 0; i < shape->num_chains(); ++i, ++count) {
        if (i > 0) out += (dim == 2) ? "; " : " | ";
        S2Shape::Chain chain = shape->chain(i);
        if (chain.length == 0) {
          S2_DCHECK_EQ(dim, 2);
          out += "full";
        } else {
          AppendVertex(shape->edge(chain.start).v0, &out);
        }
        int limit = chain.start + chain.length;
        if (dim != 1) --limit;
        for (int e = chain.start; e < limit; ++e) {
          out += ", ";
          AppendVertex(shape->edge(e).v1, &out);
        }
      }
    }
    // Example output: "# #", "0:0 # #", "# # 0:0, 0:1, 1:0"
    if (dim == 1 || (dim == 0 && count > 0)) out += " ";
  }
  return out;
}